

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,optional<tinyusdz::Token> *value)

{
  bool bVar1;
  token v;
  token local_38;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<tinyusdz::Token>::reset(value);
    bVar1 = true;
  }
  else {
    local_38.str_._M_dataplus._M_p = (pointer)&local_38.str_.field_2;
    local_38.str_._M_string_length = 0;
    local_38.str_.field_2._M_local_buf[0] = '\0';
    bVar1 = ReadBasicType(this,&local_38);
    if (bVar1) {
      nonstd::optional_lite::optional<tinyusdz::Token>::operator=(value,&local_38);
    }
    ::std::__cxx11::string::_M_dispose();
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::token> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::token v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}